

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

_Bool plutovg_path_parse(plutovg_path_t *path,char *data,int length)

{
  char *pcVar1;
  undefined4 y;
  byte bVar2;
  _Bool _Var3;
  size_t sVar4;
  byte bVar5;
  byte bVar6;
  char *end;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  char *it;
  _Bool flags [2];
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  
  if (length == -1) {
    sVar4 = strlen(data);
    length = (int)sVar4;
  }
  end = data + length;
  it = data;
  plutovg_skip_ws(&it,end);
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_48 = 0;
  fStack_40 = 0.0;
  fStack_3c = 0.0;
  local_88 = 0.0;
  bVar5 = 0;
LAB_00126ea9:
  do {
    pcVar1 = it;
    if (end <= it) {
LAB_001273f2:
      return end <= pcVar1;
    }
    bVar2 = *it;
    bVar6 = bVar5;
    if ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) {
      it = it + 1;
      plutovg_skip_ws(&it,end);
      bVar6 = bVar2;
    }
    bVar2 = bVar6 | 0x20;
    if (bVar5 != 0) {
      if (bVar2 == 0x6d) goto LAB_00126f63;
      if (bVar2 == 0x6c) {
        _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,2);
        if (!_Var3) goto LAB_001273f2;
        fVar10 = (float)local_a8;
        fVar11 = (float)((ulong)local_a8 >> 0x20);
        fVar12 = 0.0;
        fVar13 = 0.0;
        if (bVar6 == 0x6c) {
          fVar10 = fVar10 + local_88;
          fVar11 = fVar11 + fStack_84;
          fVar12 = fStack_80 + 0.0;
          fVar13 = fStack_7c + 0.0;
          local_a8 = CONCAT44(fVar11,fVar10);
        }
        local_88 = fVar10;
        fStack_84 = fVar11;
        fStack_80 = fVar12;
        fStack_7c = fVar13;
        plutovg_path_line_to(path,fVar10,fVar11);
        bVar5 = bVar6;
      }
      else if (bVar2 == 0x68) {
        local_78._4_4_ = fStack_84;
        local_78._0_4_ = fStack_84;
        fStack_70 = fStack_84;
        fStack_6c = fStack_84;
        _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,1);
        if (!_Var3) goto LAB_001273f2;
        fVar10 = (float)local_a8;
        if (bVar6 == 0x68) {
          fVar10 = (float)local_a8 + local_88;
          local_a8 = CONCAT44(local_a8._4_4_,fVar10);
        }
        y = local_78._0_4_;
        _local_78 = ZEXT416((uint)fVar10);
        plutovg_path_line_to(path,fVar10,(float)y);
        local_88 = (float)local_78._0_4_;
        bVar5 = bVar6;
      }
      else if (bVar2 == 0x76) {
        local_78._4_4_ = fStack_84;
        local_78._0_4_ = fStack_84;
        fStack_70 = fStack_84;
        fStack_6c = fStack_84;
        _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,1,1);
        if (!_Var3) goto LAB_001273f2;
        fVar10 = local_a8._4_4_;
        if (bVar6 == 0x76) {
          fVar10 = local_a8._4_4_ + (float)local_78._0_4_;
          local_a8 = CONCAT44(fVar10,(float)local_a8);
        }
        _local_78 = ZEXT416((uint)fVar10);
        plutovg_path_line_to(path,local_88,fVar10);
        fStack_84 = (float)local_78._0_4_;
        bVar5 = bVar6;
      }
      else if (bVar2 == 0x71) {
        _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,4);
        if (!_Var3) goto LAB_001273f2;
        fVar12 = (float)local_a8;
        fVar13 = (float)((ulong)local_a8 >> 0x20);
        fVar8 = 0.0;
        fVar9 = 0.0;
        fVar10 = 0.0;
        fVar11 = 0.0;
        fVar7 = fVar13;
        if (bVar6 == 0x71) {
          fVar12 = fVar12 + local_88;
          fVar13 = fVar13 + fStack_84;
          fVar8 = fStack_80 + 0.0;
          fVar9 = fStack_7c + 0.0;
          fStack_a0 = fStack_a0 + local_88;
          fStack_9c = fStack_9c + fStack_84;
          fVar10 = fStack_80 + 0.0;
          fVar11 = fStack_7c + 0.0;
          local_a8 = CONCAT44(fVar13,fVar12);
          fVar7 = fVar13;
        }
LAB_00127106:
        local_58 = CONCAT44(fVar7,fVar12);
        uStack_50 = CONCAT44(fVar9,fVar8);
        local_68 = CONCAT44(fVar7,fVar13);
        uStack_60 = CONCAT44(fVar7,fVar7);
        local_88 = fStack_a0;
        fStack_84 = fStack_9c;
        fStack_80 = fVar10;
        fStack_7c = fVar11;
        plutovg_path_quad_to(path,fVar12,fVar13,fStack_a0,fStack_9c);
        bVar5 = bVar6;
      }
      else {
        if (bVar2 == 99) {
          _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,6);
          if (!_Var3) goto LAB_001273f2;
          fVar12 = 0.0;
          fVar13 = 0.0;
          fVar7 = (float)local_a8;
          fVar8 = local_a8._4_4_;
          fVar10 = fStack_a0;
          fVar11 = fStack_9c;
          if (bVar6 == 99) {
            fVar7 = (float)local_a8 + local_88;
            fVar8 = local_a8._4_4_ + fStack_84;
            fVar10 = fStack_a0 + local_88;
            fVar11 = fStack_9c + fStack_84;
            local_a8 = CONCAT44(fVar8,fVar7);
            fStack_98 = fStack_98 + local_88;
            fStack_94 = fStack_94 + fStack_84;
            fVar12 = fStack_80 + 0.0;
            fVar13 = fStack_7c + 0.0;
            fStack_a0 = fVar10;
            fStack_9c = fVar11;
          }
        }
        else {
          if (bVar2 == 0x74) {
            fVar11 = fStack_84;
            fVar10 = local_88;
            if ((bVar5 - 0x51 < 0x24) && ((0x900000009U >> ((ulong)(bVar5 - 0x51) & 0x3f) & 1) != 0)
               ) {
              fVar11 = (fStack_84 + fStack_84) - (float)local_68;
              fVar10 = (local_88 + local_88) - (float)local_58;
            }
            local_a8 = CONCAT44(fVar11,fVar10);
            _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,2,2);
            if (_Var3) {
              fVar10 = 0.0;
              fVar11 = 0.0;
              if (bVar6 == 0x74) {
                fStack_a0 = fStack_a0 + local_88;
                fStack_9c = fStack_9c + fStack_84;
                fVar10 = fStack_80 + 0.0;
                fVar11 = fStack_7c + 0.0;
              }
              fVar8 = 0.0;
              fVar9 = 0.0;
              fVar12 = (float)local_a8;
              fVar13 = local_a8._4_4_;
              fVar7 = 0.0;
              goto LAB_00127106;
            }
            goto LAB_001273f2;
          }
          if (bVar2 != 0x73) {
            if (bVar2 == 0x61) {
              _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,3);
              if ((((!_Var3) || (_Var3 = parse_arc_flag(&it,end,flags), !_Var3)) ||
                  (_Var3 = parse_arc_flag(&it,end,flags + 1), !_Var3)) ||
                 (_Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,3,2), !_Var3))
              goto LAB_001273f2;
              fVar10 = 0.0;
              fVar11 = 0.0;
              if (bVar6 == 0x61) {
                fStack_9c = fStack_9c + local_88;
                fStack_98 = fStack_98 + fStack_84;
                fVar10 = fStack_80 + 0.0;
                fVar11 = fStack_7c + 0.0;
              }
              local_88 = fStack_9c;
              fStack_84 = fStack_98;
              fStack_80 = fVar10;
              fStack_7c = fVar11;
              plutovg_path_arc_to(path,(float)local_a8,local_a8._4_4_,fStack_a0 * 0.017453292,
                                  flags[0],flags[1],fStack_9c,fStack_98);
              bVar5 = bVar6;
            }
            else {
              if (((bVar6 & 0xdf) != 0x5a) || ((bVar5 & 0xdf) == 0x5a)) goto LAB_001273f2;
              plutovg_path_close(path);
              local_88 = (float)local_48;
              fStack_84 = local_48._4_4_;
              fStack_80 = fStack_40;
              fStack_7c = fStack_3c;
              bVar5 = bVar6;
            }
            goto LAB_00126ea9;
          }
          fVar11 = fStack_84;
          fVar10 = local_88;
          if ((byte)((bVar5 + 0xbd) * '\x10' | (byte)(bVar5 + 0xbd) >> 4) < 4) {
            fVar11 = (fStack_84 + fStack_84) - (float)local_68;
            fVar10 = (local_88 + local_88) - (float)local_58;
          }
          local_a8 = CONCAT44(fVar11,fVar10);
          _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,2,4);
          if (!_Var3) goto LAB_001273f2;
          fVar10 = 0.0;
          fVar11 = 0.0;
          fVar12 = 0.0;
          fVar13 = 0.0;
          if (bVar6 == 0x73) {
            fStack_a0 = fStack_a0 + local_88;
            fStack_9c = fStack_9c + fStack_84;
            fVar10 = fStack_80 + 0.0;
            fVar11 = fStack_7c + 0.0;
            fStack_98 = fStack_98 + local_88;
            fStack_94 = fStack_94 + fStack_84;
            fVar12 = fStack_80 + 0.0;
            fVar13 = fStack_7c + 0.0;
          }
          fVar7 = (float)local_a8;
          fVar8 = local_a8._4_4_;
        }
        local_58 = CONCAT44(fStack_9c,fStack_a0);
        uStack_50 = CONCAT44(fVar11,fVar10);
        local_68 = CONCAT44(fStack_9c,fStack_9c);
        uStack_60 = CONCAT44(fStack_9c,fStack_9c);
        local_88 = fStack_98;
        fStack_84 = fStack_94;
        fStack_80 = fVar12;
        fStack_7c = fVar13;
        plutovg_path_cubic_to(path,fVar7,fVar8,fStack_a0,fStack_9c,fStack_98,fStack_94);
        bVar5 = bVar6;
      }
      goto LAB_00126ea9;
    }
    if (bVar2 != 0x6d) goto LAB_001273f2;
LAB_00126f63:
    _Var3 = parse_path_coordinates(&it,end,(float *)&local_a8,0,2);
    if (!_Var3) goto LAB_001273f2;
    bVar5 = 0x4c;
    local_48 = local_a8;
    fStack_40 = 0.0;
    fStack_3c = 0.0;
    if (bVar6 == 0x6d) {
      local_48._0_4_ = (float)local_a8;
      local_48._4_4_ = (float)((ulong)local_a8 >> 0x20);
      fStack_40 = fStack_80 + 0.0;
      fStack_3c = fStack_7c + 0.0;
      local_48 = CONCAT44(local_48._4_4_ + fStack_84,(float)local_48 + local_88);
      bVar5 = 0x6c;
    }
    local_a8 = local_48;
    plutovg_path_move_to(path,(float)local_48,local_48._4_4_);
    local_88 = (float)local_48;
    fStack_84 = local_48._4_4_;
    fStack_80 = fStack_40;
    fStack_7c = fStack_3c;
  } while( true );
}

Assistant:

bool plutovg_path_parse(plutovg_path_t* path, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;

    float values[6];
    bool flags[2];

    float start_x = 0;
    float start_y = 0;
    float current_x = 0;
    float current_y = 0;
    float last_control_x = 0;
    float last_control_y = 0;

    char command = 0;
    char last_command = 0;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(PLUTOVG_IS_ALPHA(*it)) {
            command = *it++;
            plutovg_skip_ws(&it, end);
        }

        if(!last_command && !(command == 'M' || command == 'm'))
            return false;
        if(command == 'M' || command == 'm') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'm') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_move_to(path, values[0], values[1]);
            current_x = start_x = values[0];
            current_y = start_y = values[1];
            command = command == 'm' ? 'l' : 'L';
        } else if(command == 'L' || command == 'l') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'l') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_line_to(path, values[0], values[1]);
            current_x = values[0];
            current_y = values[1];
        } else if(command == 'H' || command == 'h') {
            if(!parse_path_coordinates(&it, end, values, 0, 1))
                return false;
            if(command == 'h') {
                values[0] += current_x;
            }

            plutovg_path_line_to(path, values[0], current_y);
            current_x = values[0];
        } else if(command == 'V' || command == 'v') {
            if(!parse_path_coordinates(&it, end, values, 1, 1))
                return false;
            if(command == 'v') {
                values[1] += current_y;
            }

            plutovg_path_line_to(path, current_x, values[1]);
            current_y = values[1];
        } else if(command == 'Q' || command == 'q') {
            if(!parse_path_coordinates(&it, end, values, 0, 4))
                return false;
            if(command == 'q') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'C' || command == 'c') {
            if(!parse_path_coordinates(&it, end, values, 0, 6))
                return false;
            if(command == 'c') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'T' || command == 't') {
            if(last_command != 'Q' && last_command != 'q' && last_command != 'T' && last_command != 't') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 2))
                return false;
            if(command == 't') {
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'S' || command == 's') {
            if(last_command != 'C' && last_command != 'c' && last_command != 'S' && last_command != 's') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 4))
                return false;
            if(command == 's') {
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'A' || command == 'a') {
            if(!parse_path_coordinates(&it, end, values, 0, 3)
                || !parse_arc_flag(&it, end, &flags[0])
                || !parse_arc_flag(&it, end, &flags[1])
                || !parse_path_coordinates(&it, end, values, 3, 2)) {
                return false;
            }

            if(command == 'a') {
                values[3] += current_x;
                values[4] += current_y;
            }

            plutovg_path_arc_to(path, values[0], values[1], PLUTOVG_DEG2RAD(values[2]), flags[0], flags[1], values[3], values[4]);
            current_x = values[3];
            current_y = values[4];
        } else if(command == 'Z' || command == 'z') {
            if(last_command == 'Z' || last_command == 'z')
                return false;
            plutovg_path_close(path);
            current_x = start_x;
            current_y = start_y;
        } else {
            return false;
        }

        last_command = command;
    }

    return true;
}